

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O2

int __thiscall
Fl_Text_Display::handle_vline
          (Fl_Text_Display *this,int mode,int lineStartPos,int lineLen,int leftChar,int rightChar,
          int Y,int bottomClip,int leftClip,int rightClip)

{
  char c;
  uint uVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  int iVar5;
  char cVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  double dVar10;
  int length;
  uint local_78;
  char *local_68;
  
  iVar5 = 0;
  if (lineStartPos == -1) {
    local_68 = (char *)0x0;
  }
  else {
    local_68 = Fl_Text_Buffer::text_range(this->mBuffer,lineStartPos,lineLen + lineStartPos);
  }
  if (mode != 3) {
    if (mode == 2) {
      mode = 1;
    }
    else {
      iVar5 = (this->text_area).x - this->mHorizOffset;
    }
  }
  if (local_68 == (char *)0x0) {
    if (mode == 1) {
      return lineStartPos;
    }
    if (mode == 0) {
      iVar2 = position_style(this,lineStartPos,lineLen,-1);
      iVar5 = (this->text_area).x;
      draw_string(this,iVar2 + 0x1000,iVar5,Y,(this->text_area).w + iVar5,(char *)0x0,lineLen);
    }
    return 0;
  }
  local_78 = position_style(this,lineStartPos,lineLen,0);
  uVar9 = 0;
  cVar6 = '\0';
  for (uVar1 = 0; uVar7 = (uint)uVar9, (int)uVar1 < lineLen; uVar1 = uVar1 + iVar2) {
    c = local_68[uVar1];
    iVar2 = fl_utf8len1(c);
    if (iVar2 < 2) {
      iVar2 = 1;
    }
    uVar3 = position_style(this,lineStartPos,lineLen,uVar1);
    if (((cVar6 == '\t') || (c == '\t')) || (uVar3 != local_78)) {
      if (cVar6 == '\t') {
        dVar10 = col_to_x(this,(double)this->mBuffer->mTabDist);
        iVar8 = (this->mHorizOffset + iVar5) - (this->text_area).x;
        if (mode == 3) {
          iVar8 = iVar5;
        }
        iVar8 = (iVar8 / (int)dVar10 + 1) * (int)dVar10 - iVar8;
        if (mode == 1) {
          if (rightClip < iVar8 + iVar5) {
            free(local_68);
            return uVar7 + lineStartPos;
          }
        }
        else if (mode == 0) {
          local_78 = local_78 | 0x1000;
          length = 0;
          pcVar4 = (char *)0x0;
LAB_001ce6f6:
          draw_string(this,local_78,iVar5,Y,iVar8 + iVar5,pcVar4,length);
        }
      }
      else {
        pcVar4 = local_68 + uVar9;
        length = uVar1 - uVar7;
        dVar10 = string_width(this,pcVar4,length,local_78);
        iVar8 = (int)dVar10;
        if (mode == 1) {
          if (rightClip < iVar8 + iVar5) {
            iVar5 = find_x(this,pcVar4,length,local_78,rightClip - iVar5);
            free(local_68);
            return uVar7 + lineStartPos + iVar5;
          }
        }
        else if (mode == 0) goto LAB_001ce6f6;
      }
      iVar5 = iVar5 + iVar8;
      uVar7 = uVar1;
      local_78 = uVar3;
    }
    uVar9 = (ulong)uVar7;
    cVar6 = c;
  }
  if (cVar6 == '\t') {
    dVar10 = col_to_x(this,(double)this->mBuffer->mTabDist);
    iVar8 = (this->mHorizOffset + iVar5) - (this->text_area).x;
    if (mode == 3) {
      iVar8 = iVar5;
    }
    iVar8 = (iVar8 / (int)dVar10 + 1) * (int)dVar10 - iVar8;
    if (mode == 0) {
      draw_string(this,local_78 | 0x1000,iVar5,Y,iVar8 + iVar5,(char *)0x0,0);
      goto LAB_001ce92f;
    }
    if (mode == 1) {
      free(local_68);
      return (uint)(iVar8 < rightClip - iVar5) + uVar7 + lineStartPos;
    }
  }
  else {
    pcVar4 = local_68 + uVar9;
    iVar2 = uVar1 - uVar7;
    dVar10 = string_width(this,pcVar4,iVar2,local_78);
    if (mode == 1) {
      iVar5 = find_x(this,pcVar4,iVar2,local_78,rightClip - iVar5);
      free(local_68);
      return uVar7 + lineStartPos + iVar5;
    }
    iVar8 = (int)dVar10;
    if (mode == 0) {
      draw_string(this,local_78,iVar5,Y,iVar5 + iVar8,pcVar4,iVar2);
      goto LAB_001ce92f;
    }
  }
  if (mode == 3) {
    free(local_68);
    return iVar8 + iVar5;
  }
LAB_001ce92f:
  uVar1 = position_style(this,lineStartPos,lineLen,uVar1);
  if (mode == 0) {
    draw_string(this,uVar1 | 0x1000,iVar8 + iVar5,Y,(this->text_area).w + (this->text_area).x,
                local_68,lineLen);
  }
  free(local_68);
  return lineStartPos + lineLen;
}

Assistant:

int Fl_Text_Display::handle_vline(
                                  int mode,
                                  int lineStartPos, int lineLen, int leftChar, int rightChar,
                                  int Y, int bottomClip,
                                  int leftClip, int rightClip) const
{
  IS_UTF8_ALIGNED2(buffer(), lineStartPos)

  // FIXME: we need to allow two modes for FIND_INDEX: one on the edge of the
  // FIXME: character for selection, and one on the character center for cursors.
  int i, X, startX, startIndex, style, charStyle;
  char *lineStr;

  if ( lineStartPos == -1 ) {
    lineStr = NULL;
  } else {
    lineStr = mBuffer->text_range( lineStartPos, lineStartPos + lineLen );
  }

  if (mode==GET_WIDTH) {
    X = 0;
  } else if (mode==FIND_INDEX_FROM_ZERO) {
    X = 0;
    mode = FIND_INDEX;
  } else {
    X = text_area.x - mHorizOffset;
  }

  startX = X;
  startIndex = 0;
  if (!lineStr) {
    // just clear the background
    if (mode==DRAW_LINE) {
      style = position_style(lineStartPos, lineLen, -1);
      draw_string( style|BG_ONLY_MASK, text_area.x, Y, text_area.x+text_area.w, lineStr, lineLen );
    }
    if (mode==FIND_INDEX) {
      IS_UTF8_ALIGNED2(buffer(), lineStartPos)
      return lineStartPos;
    }
    return 0;
  }

  char currChar = 0, prevChar = 0;
  // draw the line
  style = position_style(lineStartPos, lineLen, 0);
  for (i=0; i<lineLen; ) {
    currChar = lineStr[i]; // one byte is enough to handele tabs and other cases
    int len = fl_utf8len1(currChar);
    if (len<=0) len = 1; // OUCH!
    charStyle = position_style(lineStartPos, lineLen, i);
    if (charStyle!=style || currChar=='\t' || prevChar=='\t') {
      // draw a segment whenever the style changes or a Tab is found
      int w = 0;
      if (prevChar=='\t') {
        // draw a single Tab space
        int tab = (int)col_to_x(mBuffer->tab_distance());
        int xAbs = (mode==GET_WIDTH) ? startX : startX+mHorizOffset-text_area.x;
        w = (((xAbs/tab)+1)*tab) - xAbs;
        if (mode==DRAW_LINE)
          draw_string( style|BG_ONLY_MASK, startX, Y, startX+w, 0, 0 );
        if (mode==FIND_INDEX && startX+w>rightClip) {
          // find x pos inside block
          free(lineStr);
          return lineStartPos + startIndex;
        }
      } else {
        // draw a text segment
        w = int( string_width( lineStr+startIndex, i-startIndex, style ) );
        if (mode==DRAW_LINE)
          draw_string( style, startX, Y, startX+w, lineStr+startIndex, i-startIndex );
        if (mode==FIND_INDEX && startX+w>rightClip) {
          // find x pos inside block
          int di = find_x(lineStr+startIndex, i-startIndex, style, rightClip-startX);
          free(lineStr);
          IS_UTF8_ALIGNED2(buffer(), (lineStartPos+startIndex+di))
          return lineStartPos + startIndex + di;
        }
      }
      style = charStyle;
      startX += w;
      startIndex = i;
    }
    i += len;
    prevChar = currChar;
  }
  int w = 0;
  if (currChar=='\t') {
    // draw a single Tab space
    int tab = (int)col_to_x(mBuffer->tab_distance());
    int xAbs = (mode==GET_WIDTH) ? startX : startX+mHorizOffset-text_area.x;
    w = (((xAbs/tab)+1)*tab) - xAbs;
    if (mode==DRAW_LINE)
      draw_string( style|BG_ONLY_MASK, startX, Y, startX+w, 0, 0 );
    if (mode==FIND_INDEX) {
      // find x pos inside block
      free(lineStr);
      return lineStartPos + startIndex + ( rightClip-startX>w ? 1 : 0 );
    }
  } else {
    w = int( string_width( lineStr+startIndex, i-startIndex, style ) );
    if (mode==DRAW_LINE)
      draw_string( style, startX, Y, startX+w, lineStr+startIndex, i-startIndex );
    if (mode==FIND_INDEX) {
      // find x pos inside block
      int di = find_x(lineStr+startIndex, i-startIndex, style, rightClip-startX);
      free(lineStr);
      IS_UTF8_ALIGNED2(buffer(), (lineStartPos+startIndex+di))
      return lineStartPos + startIndex + di;
    }
  }
  if (mode==GET_WIDTH) {
    free(lineStr);
    return startX+w;
  }

  // clear the rest of the line
  startX += w;
  style = position_style(lineStartPos, lineLen, i);
  if (mode==DRAW_LINE)
    draw_string( style|BG_ONLY_MASK, startX, Y, text_area.x+text_area.w, lineStr, lineLen );

  free(lineStr);
  IS_UTF8_ALIGNED2(buffer(), (lineStartPos+lineLen))
  return lineStartPos + lineLen;
}